

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_common.c
# Opt level: O2

size_t FSE_readNCount(short *normalizedCounter,uint *maxSVPtr,uint *tableLogPtr,void *headerBuffer,
                     size_t hbSize)

{
  int iVar1;
  uint *puVar2;
  uint symbNb;
  uint uVar3;
  size_t sVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  uint *puVar13;
  uint *puVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  uint *puVar19;
  bool bVar20;
  size_t sStack_60;
  char buffer [4];
  
  if (hbSize < 4) {
    buffer[0] = '\0';
    buffer[1] = '\0';
    buffer[2] = '\0';
    buffer[3] = '\0';
    memcpy(buffer,headerBuffer,hbSize);
    sVar4 = FSE_readNCount(normalizedCounter,maxSVPtr,tableLogPtr,buffer,4);
    sStack_60 = 0xfffffffffffffffc;
    if (sVar4 <= hbSize) {
      sStack_60 = sVar4;
    }
    if (0xfffffffffffffff7 < sVar4) {
      sStack_60 = sVar4;
    }
  }
  else {
    uVar8 = *headerBuffer & 0xf;
    if (uVar8 < 0xb) {
      uVar10 = *headerBuffer >> 4;
      *tableLogPtr = uVar8 + 5;
      iVar16 = 0x20 << (sbyte)uVar8;
      iVar17 = iVar16 + 1;
      iVar9 = uVar8 + 6;
      uVar8 = *maxSVPtr;
      puVar2 = (uint *)((long)headerBuffer + (hbSize - 7));
      puVar19 = (uint *)((long)headerBuffer + (hbSize - 4));
      bVar20 = true;
      uVar3 = 4;
      uVar15 = 0;
      puVar13 = (uint *)headerBuffer;
      while ((uVar5 = (uint)uVar15, 1 < iVar17 && (uVar5 <= uVar8))) {
        if (!bVar20) {
          uVar7 = uVar3 + 2;
          uVar12 = uVar15;
          uVar5 = uVar3;
          while (uVar3 = uVar7, (short)uVar10 == -1) {
            if (puVar13 < (uint *)((long)headerBuffer + (hbSize - 5))) {
              puVar14 = (uint *)((long)puVar13 + 2);
              puVar13 = (uint *)((long)puVar13 + 2);
              uVar10 = *puVar14 >> ((byte)uVar5 & 0x1f);
              uVar12 = (ulong)((int)uVar12 + 0x18);
            }
            else {
              uVar10 = uVar10 >> 0x10;
              uVar5 = uVar5 + 0x10;
              uVar12 = (ulong)((int)uVar12 + 0x18);
              uVar7 = uVar7 + 0x10;
            }
          }
          for (; (~uVar10 & 3) == 0; uVar10 = uVar10 >> 2) {
            uVar12 = (ulong)((int)uVar12 + 3);
            uVar3 = uVar3 + 2;
          }
          uVar5 = (uVar10 & 3) + (int)uVar12;
          if (uVar8 < uVar5) {
            return 0xfffffffffffffff9;
          }
          for (; uVar15 < uVar5; uVar15 = uVar15 + 1) {
            normalizedCounter[uVar15] = 0;
          }
          iVar6 = (int)uVar3 >> 3;
          puVar14 = (uint *)((long)puVar13 + (long)iVar6);
          if ((puVar2 < puVar13) && (puVar19 < puVar14)) {
            uVar10 = uVar10 >> 2;
          }
          else {
            uVar3 = uVar3 & 7;
            uVar10 = *(uint *)((long)puVar13 + (long)iVar6) >> (sbyte)uVar3;
            puVar13 = puVar14;
          }
        }
        uVar5 = iVar16 * 2 - 1;
        uVar7 = uVar5 - iVar17;
        uVar18 = iVar16 - 1U & uVar10;
        if (uVar18 < uVar7) {
          iVar6 = iVar9 + -1;
        }
        else {
          uVar10 = uVar10 & uVar5;
          if ((int)uVar10 < iVar16) {
            uVar7 = 0;
          }
          uVar18 = uVar10 - uVar7;
          iVar6 = iVar9;
        }
        iVar1 = uVar18 - 1;
        iVar11 = 1 - uVar18;
        if (0 < (int)uVar18) {
          iVar11 = iVar1;
        }
        iVar17 = iVar17 - iVar11;
        normalizedCounter[uVar15 & 0xffffffff] = (short)iVar1;
        for (; iVar17 < iVar16; iVar16 = iVar16 >> 1) {
          iVar9 = iVar9 + -1;
        }
        uVar10 = iVar6 + uVar3;
        uVar15 = (ulong)((int)uVar15 + 1);
        bVar20 = iVar1 != 0;
        puVar14 = (uint *)((long)((int)uVar10 >> 3) + (long)puVar13);
        uVar3 = uVar10 & 7;
        if (puVar2 < puVar13 && puVar19 < puVar14) {
          puVar14 = puVar19;
          uVar3 = uVar10 + ((int)puVar13 - (int)puVar19) * 8;
        }
        uVar10 = *puVar14 >> ((byte)uVar3 & 0x1f);
        puVar13 = puVar14;
      }
      sStack_60 = 0xfffffffffffffffc;
      if ((iVar17 == 1) && ((int)uVar3 < 0x21)) {
        for (; (uint)uVar15 <= uVar8; uVar15 = (ulong)((uint)uVar15 + 1)) {
          normalizedCounter[uVar15] = 0;
        }
        *maxSVPtr = uVar5 - 1;
        sStack_60 = (long)puVar13 + ((long)((int)(uVar3 + 7) >> 3) - (long)headerBuffer);
      }
    }
    else {
      sStack_60 = 0xfffffffffffffffb;
    }
  }
  return sStack_60;
}

Assistant:

size_t FSE_readNCount (short* normalizedCounter, unsigned* maxSVPtr, unsigned* tableLogPtr,
                 const void* headerBuffer, size_t hbSize)
{
    const BYTE* const istart = (const BYTE*) headerBuffer;
    const BYTE* const iend = istart + hbSize;
    const BYTE* ip = istart;
    int nbBits;
    int remaining;
    int threshold;
    U32 bitStream;
    int bitCount;
    unsigned charnum = 0;
    int previous0 = 0;

    DEBUGLOG(5, "FSE_readNCount");

    if (hbSize < 4) {
        /* This function only works when hbSize >= 4 */
        char buffer[4];
        memset(buffer, 0, sizeof(buffer));
        memcpy(buffer, headerBuffer, hbSize);
        {   size_t const countSize = FSE_readNCount(normalizedCounter, maxSVPtr, tableLogPtr,
                                                    buffer, sizeof(buffer));
            if (FSE_isError(countSize)) return countSize;
            if (countSize > hbSize) return ERROR(corruption_detected);
            return countSize;
    }   }
    assert(hbSize >= 4);

    bitStream = MEM_readLE32(ip);
    nbBits = (bitStream & 0xF) + FSE_MIN_TABLELOG;   /* extract tableLog */
    if (nbBits > FSE_TABLELOG_ABSOLUTE_MAX) return ERROR(tableLog_tooLarge);
    bitStream >>= 4;
    bitCount = 4;
    *tableLogPtr = nbBits;
    remaining = (1<<nbBits)+1;
    threshold = 1<<nbBits;
    nbBits++;

    while ((remaining>1) & (charnum<=*maxSVPtr)) {
        if (previous0) {
            unsigned n0 = charnum;
            while ((bitStream & 0xFFFF) == 0xFFFF) {
                n0 += 24;
                if (ip < iend-5) {
                    ip += 2;
                    bitStream = MEM_readLE32(ip) >> bitCount;
                } else {
                    bitStream >>= 16;
                    bitCount   += 16;
            }   }
            while ((bitStream & 3) == 3) {
                n0 += 3;
                bitStream >>= 2;
                bitCount += 2;
            }
            n0 += bitStream & 3;
            bitCount += 2;
            if (n0 > *maxSVPtr) return ERROR(maxSymbolValue_tooSmall);
            while (charnum < n0) normalizedCounter[charnum++] = 0;
            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                assert((bitCount >> 3) <= 3); /* For first condition to work */
                ip += bitCount>>3;
                bitCount &= 7;
                bitStream = MEM_readLE32(ip) >> bitCount;
            } else {
                bitStream >>= 2;
        }   }
        {   int const max = (2*threshold-1) - remaining;
            int count;

            if ((bitStream & (threshold-1)) < (U32)max) {
                count = bitStream & (threshold-1);
                bitCount += nbBits-1;
            } else {
                count = bitStream & (2*threshold-1);
                if (count >= threshold) count -= max;
                bitCount += nbBits;
            }

            count--;   /* extra accuracy */
            remaining -= count < 0 ? -count : count;   /* -1 means +1 */
            normalizedCounter[charnum++] = (short)count;
            previous0 = !count;
            while (remaining < threshold) {
                nbBits--;
                threshold >>= 1;
            }

            if ((ip <= iend-7) || (ip + (bitCount>>3) <= iend-4)) {
                ip += bitCount>>3;
                bitCount &= 7;
            } else {
                bitCount -= (int)(8 * (iend - 4 - ip));
                ip = iend - 4;
            }
            bitStream = MEM_readLE32(ip) >> (bitCount & 31);
    }   }   /* while ((remaining>1) & (charnum<=*maxSVPtr)) */
    if (remaining != 1) return ERROR(corruption_detected);
    if (bitCount > 32) return ERROR(corruption_detected);
    /* zeroise the rest */
    {   unsigned symbNb = charnum;
        for (symbNb=charnum; symbNb <= *maxSVPtr; symbNb++)
            normalizedCounter[symbNb] = 0;
    }
    *maxSVPtr = charnum-1;

    ip += (bitCount+7)>>3;
    return ip-istart;
}